

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeVector(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  int32_t iVar3;
  DiagnosticStream *pDVar4;
  char *local_5f0;
  DiagnosticStream local_5e8;
  char *local_410;
  DiagnosticStream local_408;
  uint local_22c;
  undefined1 local_228 [4];
  uint num_components;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *component_type;
  uint component_id;
  int component_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  component_type._4_4_ = 1;
  _component_id = inst;
  inst_local = (Instruction *)_;
  component_type._0_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,1);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)component_type);
  if (local_30 != (Instruction *)0x0) {
    OVar2 = val::Instruction::opcode(local_30);
    iVar3 = spvOpcodeIsScalarType(OVar2);
    if (iVar3 != 0) {
      local_22c = val::Instruction::GetOperandAs<unsigned_int_const>(_component_id,2);
      if (((local_22c != 2) && (local_22c != 3)) && (local_22c != 4)) {
        if ((local_22c != 8) && (local_22c != 0x10)) {
          ValidationState_t::diag
                    (&local_5e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_component_id
                    );
          pDVar4 = DiagnosticStream::operator<<
                             (&local_5e8,(char (*) [31])"Illegal number of components (");
          pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_22c);
          pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [7])") for ");
          OVar2 = val::Instruction::opcode(_component_id);
          local_5f0 = spvOpcodeString(OVar2);
          pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_5f0);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_5e8);
          return __local._4_4_;
        }
        bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityVector16)
        ;
        if (!bVar1) {
          ValidationState_t::diag
                    (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_component_id
                    );
          pDVar4 = DiagnosticStream::operator<<(&local_408,(char (*) [8])"Having ");
          pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_22c);
          pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [17])" components for ");
          OVar2 = val::Instruction::opcode(_component_id);
          local_410 = spvOpcodeString(OVar2);
          pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_410);
          pDVar4 = DiagnosticStream::operator<<
                             (pDVar4,(char (*) [34])" requires the Vector16 capability");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_408);
          return __local._4_4_;
        }
        return SPV_SUCCESS;
      }
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_component_id);
  pDVar4 = DiagnosticStream::operator<<
                     (&local_208,(char (*) [34])"OpTypeVector Component Type <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)local_228,(ValidationState_t *)inst_local,(uint)component_type);
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228);
  pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [23])" is not a scalar type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  std::__cxx11::string::~string((string *)local_228);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeVector(ValidationState_t& _, const Instruction* inst) {
  const auto component_index = 1;
  const auto component_id = inst->GetOperandAs<uint32_t>(component_index);
  const auto component_type = _.FindDef(component_id);
  if (!component_type || !spvOpcodeIsScalarType(component_type->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpTypeVector Component Type <id> " << _.getIdName(component_id)
           << " is not a scalar type.";
  }

  // Validates that the number of components in the vector is valid.
  // Vector types can only be parameterized as having 2, 3, or 4 components.
  // If the Vector16 capability is added, 8 and 16 components are also allowed.
  auto num_components = inst->GetOperandAs<const uint32_t>(2);
  if (num_components == 2 || num_components == 3 || num_components == 4) {
    return SPV_SUCCESS;
  } else if (num_components == 8 || num_components == 16) {
    if (_.HasCapability(spv::Capability::Vector16)) {
      return SPV_SUCCESS;
    }
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Having " << num_components << " components for "
           << spvOpcodeString(inst->opcode())
           << " requires the Vector16 capability";
  } else {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Illegal number of components (" << num_components << ") for "
           << spvOpcodeString(inst->opcode());
  }

  return SPV_SUCCESS;
}